

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::DirectoryContentsTask::inputsAvailable
          (DirectoryContentsTask *this,TaskInterface ti)

{
  Kind KVar1;
  pointer pbVar2;
  FileInfo *pFVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  long lVar4;
  uint64_t *puVar5;
  long lVar6;
  byte bVar7;
  StringRef path;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  FileInfo in_stack_fffffffffffffee8;
  TaskInterface local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  BuildValue local_98;
  ValueType local_28;
  
  local_c8.ctx = ti.ctx;
  local_c8.impl = ti.impl;
  bVar7 = 0;
  KVar1 = (this->directoryValue).kind;
  if ((int)KVar1 < 9) {
    if ((KVar1 != MissingInput) && (KVar1 != MissingOutput)) {
LAB_0012860c:
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      path.Length = (size_t)&local_b8;
      path.Data = (char *)(this->path)._M_string_length;
      getContents((DirectoryContentsTask *)(this->path)._M_dataplus._M_p,path,in_RCX);
      pFVar3 = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
      pbVar2 = local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (uint64_t *)&stack0xfffffffffffffee8;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar5 = pFVar3->device;
        pFVar3 = (FileInfo *)((long)pFVar3 + (ulong)bVar7 * -0x10 + 8);
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      values.Length = lVar6 >> 5;
      values.Data = pbVar2;
      llbuild::buildsystem::BuildValue::BuildValue
                (&local_98,DirectoryContents,in_stack_fffffffffffffee8,values);
      llbuild::buildsystem::BuildValue::toData(&local_28,&local_98);
      llbuild::core::TaskInterface::complete(&local_c8,&local_28,false);
      if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      llbuild::buildsystem::BuildValue::~BuildValue(&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      return;
    }
    local_98.kind = MissingInput;
  }
  else if (KVar1 == FailedInput) {
    local_98.kind = FailedInput;
  }
  else {
    if (KVar1 != SkippedCommand) goto LAB_0012860c;
    local_98.kind = SkippedCommand;
  }
  local_98._4_8_ = 0;
  local_98._12_8_ = 0;
  local_98.valueData._4_8_ = 0;
  local_98.valueData._12_8_ = 0;
  local_98.valueData._20_8_ = 0;
  local_98.valueData._28_8_ = 0;
  local_98.valueData._36_8_ = 0;
  local_98.valueData._44_8_ = 0;
  local_98.valueData._52_8_ = 0;
  local_98.valueData._60_8_ = 0;
  local_98.valueData._68_8_ = 0;
  local_98.valueData._76_4_ = 0;
  local_98.stringValues.contents._0_4_ = 0;
  local_98.stringValues.contents._4_4_ = 0;
  local_98.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_b8,&local_98);
  llbuild::core::TaskInterface::complete(&local_c8,(ValueType *)&local_b8,false);
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_98);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.
    
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (directoryValue.isMissingOutput()) {
      // Rewrite a missing output as a missing input build value for this node, both conceptually and as a hedge against violating the downstream expectations of other rules.
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (directoryValue.isFailedInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    // The input directory may be a 'mkdir' command, which can be cancelled or
    // skipped by the engine or the delegate. rdar://problem/50380532
    if (directoryValue.isSkippedCommand()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    std::vector<std::string> filenames;
    std::error_code ec = getContents(path, filenames);

    // Currently, tests and presumably clients expect that errors are silently
    // ignored when reading directory contents listings.
    (void)ec;

    // Create the result.
    ti.complete(BuildValue::makeDirectoryContents(directoryValue.getOutputInfo(),
                                                  filenames).toData());
  }